

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O2

int verify_stable(int **array,int64_t size,int num_values)

{
  int **array_00;
  int64_t iVar1;
  int64_t iVar2;
  int value;
  
  array_00 = original;
  value = 0;
  if (num_values < 1) {
    num_values = value;
  }
  iVar2 = 0;
  iVar1 = 0;
  do {
    if (value == num_values) {
      return 1;
    }
    while (iVar1 = find_next(array_00,iVar1,size,value), iVar1 != size) {
      iVar2 = find_next(array,iVar2,size,value);
      if (iVar2 == size) {
        return 0;
      }
      if (array_00[iVar1] != array[iVar2]) {
        return 0;
      }
      iVar1 = iVar1 + 1;
      iVar2 = iVar2 + 1;
    }
    value = value + 1;
    iVar1 = size;
  } while( true );
}

Assistant:

int verify_stable(int **array, int64_t size, int num_values) {
  int value;
  int64_t i = 0;
  int64_t j = 0;

  for (value = 0; value < num_values; value++) {
    while (1) {
      i = find_next(original, i, size, value);

      /* unlikely, but possible */
      if (i == size) {
        break;
      }

      j = find_next(array, j, size, value);

      if (j == size) {
        return 0;
      }

      if (original[i] != array[j]) {
        return 0;
      }

      i++;
      j++;
    }
  }

  return 1;
}